

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableDrawContextMenu(ImGuiTable *table)

{
  bool bVar1;
  ImGuiTableColumn *pIVar2;
  int column_n;
  char *pcVar3;
  char cVar4;
  long lVar6;
  long lVar7;
  uint uVar5;
  
  if (GImGui->CurrentWindow->SkipItems == false) {
    cVar4 = table->ContextPopupColumn;
    if (cVar4 < '\0') {
      column_n = -1;
    }
    else {
      column_n = -1;
      if ((int)cVar4 < table->ColumnsCount) {
        column_n = (int)cVar4;
      }
    }
    if (column_n == -1) {
      pIVar2 = (ImGuiTableColumn *)0x0;
    }
    else if ((column_n < 0) ||
            (pIVar2 = (table->Columns).Data + column_n, (table->Columns).DataEnd <= pIVar2)) {
LAB_0015d895:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O1/_deps/imgui-src/imgui_internal.h"
                    ,0x20e,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    uVar5 = table->Flags & 1;
    cVar4 = (char)uVar5;
    if (uVar5 != 0) {
      if (pIVar2 != (ImGuiTableColumn *)0x0) {
        if ((pIVar2->Flags & 0x10) == 0) {
          bVar1 = pIVar2->IsEnabled;
        }
        else {
          bVar1 = false;
        }
        bVar1 = MenuItem("Size column to fit###SizeOne",(char *)0x0,false,bVar1);
        if (bVar1) {
          TableSetColumnWidthAutoSingle(table,column_n);
        }
      }
      if ((table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount) &&
         ((table->Flags & 0xe000U) != 0x4000)) {
        pcVar3 = "Size all columns to fit###SizeAll";
      }
      else {
        pcVar3 = "Size all columns to default###SizeAll";
      }
      bVar1 = MenuItem(pcVar3,(char *)0x0,false,true);
      if (bVar1) {
        TableSetColumnWidthAutoAll(table);
      }
    }
    if ((table->Flags & 2) != 0) {
      bVar1 = MenuItem("Reset order",(char *)0x0,false,(bool)(table->IsDefaultDisplayOrder ^ 1));
      cVar4 = '\x01';
      if (bVar1) {
        table->IsResetDisplayOrderRequest = true;
      }
    }
    if ((table->Flags & 4) != 0) {
      if (cVar4 != '\0') {
        Separator();
      }
      PushItemFlag(0x20,true);
      if (0 < table->ColumnsCount) {
        lVar7 = 0;
        lVar6 = 0;
        do {
          pIVar2 = (table->Columns).Data;
          if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar2->Flags + lVar7))
          goto LAB_0015d895;
          pcVar3 = TableGetColumnName(table,(int)lVar6);
          if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
            pcVar3 = "<Unknown>";
          }
          uVar5 = *(uint *)((long)&pIVar2->Flags + lVar7);
          bVar1 = (uVar5 & 0x40) == 0;
          if ((&pIVar2->IsEnabled)[lVar7] == true) {
            bVar1 = '\x01' < table->ColumnsEnabledCount && (uVar5 & 0x40) == 0;
          }
          bVar1 = MenuItem(pcVar3,(char *)0x0,(&pIVar2->IsEnabled)[lVar7],bVar1);
          if (bVar1) {
            (&pIVar2->IsEnabledNextFrame)[lVar7] = (bool)((&pIVar2->IsEnabled)[lVar7] ^ 1);
          }
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + 0x68;
        } while (lVar6 < table->ColumnsCount);
      }
      PopItemFlag();
      return;
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawContextMenu(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    bool want_separator = false;
    const int column_n = (table->ContextPopupColumn >= 0 && table->ContextPopupColumn < table->ColumnsCount) ? table->ContextPopupColumn : -1;
    ImGuiTableColumn* column = (column_n != -1) ? &table->Columns[column_n] : NULL;

    // Sizing
    if (table->Flags & ImGuiTableFlags_Resizable)
    {
        if (column != NULL)
        {
            const bool can_resize = !(column->Flags & ImGuiTableColumnFlags_NoResize) && column->IsEnabled;
            if (MenuItem("Size column to fit###SizeOne", NULL, false, can_resize))
                TableSetColumnWidthAutoSingle(table, column_n);
        }

        const char* size_all_desc;
        if (table->ColumnsEnabledFixedCount == table->ColumnsEnabledCount && (table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame)
            size_all_desc = "Size all columns to fit###SizeAll";        // All fixed
        else
            size_all_desc = "Size all columns to default###SizeAll";    // All stretch or mixed
        if (MenuItem(size_all_desc, NULL))
            TableSetColumnWidthAutoAll(table);
        want_separator = true;
    }

    // Ordering
    if (table->Flags & ImGuiTableFlags_Reorderable)
    {
        if (MenuItem("Reset order", NULL, false, !table->IsDefaultDisplayOrder))
            table->IsResetDisplayOrderRequest = true;
        want_separator = true;
    }

    // Reset all (should work but seems unnecessary/noisy to expose?)
    //if (MenuItem("Reset all"))
    //    table->IsResetAllRequest = true;

    // Sorting
    // (modify TableOpenContextMenu() to add _Sortable flag if enabling this)
#if 0
    if ((table->Flags & ImGuiTableFlags_Sortable) && column != NULL && (column->Flags & ImGuiTableColumnFlags_NoSort) == 0)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        bool append_to_sort_specs = g.IO.KeyShift;
        if (MenuItem("Sort in Ascending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Ascending, (column->Flags & ImGuiTableColumnFlags_NoSortAscending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Ascending, append_to_sort_specs);
        if (MenuItem("Sort in Descending Order", NULL, column->SortOrder != -1 && column->SortDirection == ImGuiSortDirection_Descending, (column->Flags & ImGuiTableColumnFlags_NoSortDescending) == 0))
            TableSetColumnSortDirection(table, column_n, ImGuiSortDirection_Descending, append_to_sort_specs);
    }
#endif

    // Hiding / Visibility
    if (table->Flags & ImGuiTableFlags_Hideable)
    {
        if (want_separator)
            Separator();
        want_separator = true;

        PushItemFlag(ImGuiItemFlags_SelectableDontClosePopup, true);
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
        {
            ImGuiTableColumn* other_column = &table->Columns[other_column_n];
            const char* name = TableGetColumnName(table, other_column_n);
            if (name == NULL || name[0] == 0)
                name = "<Unknown>";

            // Make sure we can't hide the last active column
            bool menu_item_active = (other_column->Flags & ImGuiTableColumnFlags_NoHide) ? false : true;
            if (other_column->IsEnabled && table->ColumnsEnabledCount <= 1)
                menu_item_active = false;
            if (MenuItem(name, NULL, other_column->IsEnabled, menu_item_active))
                other_column->IsEnabledNextFrame = !other_column->IsEnabled;
        }
        PopItemFlag();
    }
}